

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int compute_gm_workers(AV1_COMP *cpi)

{
  int local_1c;
  int local_18;
  int local_14;
  int num_gm_workers;
  int total_refs;
  AV1_COMP *cpi_local;
  
  local_18 = (cpi->gm_info).num_ref_frames[0] + (cpi->gm_info).num_ref_frames[1];
  if ((cpi->sf).gm_sf.prune_ref_frame_for_gm_search != 0) {
    local_14 = local_18;
    if (2 < local_18) {
      local_14 = 2;
    }
    local_18 = local_14;
  }
  if (local_18 < (cpi->mt_info).num_workers) {
    local_1c = local_18;
  }
  else {
    local_1c = (cpi->mt_info).num_workers;
  }
  return local_1c;
}

Assistant:

static inline int compute_gm_workers(const AV1_COMP *cpi) {
  int total_refs =
      cpi->gm_info.num_ref_frames[0] + cpi->gm_info.num_ref_frames[1];
  int num_gm_workers = cpi->sf.gm_sf.prune_ref_frame_for_gm_search
                           ? AOMMIN(MAX_DIRECTIONS, total_refs)
                           : total_refs;
  num_gm_workers = AOMMIN(num_gm_workers, cpi->mt_info.num_workers);
  return (num_gm_workers);
}